

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O2

void __thiscall CorUnix::CThreadSuspensionInfo::~CThreadSuspensionInfo(CThreadSuspensionInfo *this)

{
  FILE *pFVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint *puVar5;
  
  (this->super_CThreadInfoInitializer)._vptr_CThreadInfoInitializer =
       (_func_int **)&PTR_InitializePreCreate_0135fcf8;
  if (this->m_fSuspmutexInitialized != 0) {
    uVar2 = pthread_mutex_destroy((pthread_mutex_t *)&this->m_ptmSuspmutex);
    if (uVar2 != 0) {
      fprintf(_stderr,"] %s %s:%d","~CThreadSuspensionInfo",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
              ,0x3c5);
      pFVar1 = _stderr;
      pcVar4 = strerror(uVar2);
      fprintf(pFVar1,
              "Expression: 0 == iError, Description: pthread_mutex_destroy returned %d (%s)\n",
              (ulong)uVar2,pcVar4);
    }
  }
  if (this->m_fSemaphoresInitialized != 0) {
    iVar3 = sem_destroy((sem_t *)&this->m_semSusp);
    if (iVar3 != 0) {
      fprintf(_stderr,"] %s %s:%d","~CThreadSuspensionInfo",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
              ,0x3cf);
      pFVar1 = _stderr;
      puVar5 = (uint *)__errno_location();
      uVar2 = *puVar5;
      pcVar4 = strerror(uVar2);
      fprintf(pFVar1,
              "Expression: 0 == iError, Description: sem_destroy failed and set errno to %d (%s)\n",
              (ulong)uVar2,pcVar4);
    }
    iVar3 = sem_destroy((sem_t *)&this->m_semResume);
    if (iVar3 != 0) {
      fprintf(_stderr,"] %s %s:%d","~CThreadSuspensionInfo",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
              ,0x3d2);
      pFVar1 = _stderr;
      puVar5 = (uint *)__errno_location();
      uVar2 = *puVar5;
      pcVar4 = strerror(uVar2);
      fprintf(pFVar1,
              "Expression: 0 == iError, Description: sem_destroy failed and set errno to %d (%s)\n",
              (ulong)uVar2,pcVar4);
    }
  }
  return;
}

Assistant:

CThreadSuspensionInfo::~CThreadSuspensionInfo()
{
#if !DEADLOCK_WHEN_THREAD_IS_SUSPENDED_WHILE_BLOCKED_ON_MUTEX
    if (m_fSuspmutexInitialized)
    {
        INDEBUG(int iError = )
        pthread_mutex_destroy(&m_ptmSuspmutex);
        _ASSERT_MSG(0 == iError, "pthread_mutex_destroy returned %d (%s)\n", iError, strerror(iError));
    }
#endif

#if USE_POSIX_SEMAPHORES
    if (m_fSemaphoresInitialized)
    {
        int iError;

        iError = sem_destroy(&m_semSusp);
        _ASSERT_MSG(0 == iError, "sem_destroy failed and set errno to %d (%s)\n", errno, strerror(errno));

        iError = sem_destroy(&m_semResume);
        _ASSERT_MSG(0 == iError, "sem_destroy failed and set errno to %d (%s)\n", errno, strerror(errno));
    }
#elif USE_SYSV_SEMAPHORES
    DestroySemaphoreIds();
#elif USE_PTHREAD_CONDVARS
    if (m_fSemaphoresInitialized)
    {
        int iError;

        iError = pthread_cond_destroy(&m_condSusp);
        _ASSERT_MSG(0 == iError, "pthread_cond_destroy failed with %d (%s)\n", iError, strerror(iError));

        iError = pthread_mutex_destroy(&m_mutexSusp);
        _ASSERT_MSG(0 == iError, "pthread_mutex_destroy failed with %d (%s)\n", iError, strerror(iError));

        iError = pthread_cond_destroy(&m_condResume);
        _ASSERT_MSG(0 == iError, "pthread_cond_destroy failed with %d (%s)\n", iError, strerror(iError));

        iError = pthread_mutex_destroy(&m_mutexResume);
        _ASSERT_MSG(0 == iError, "pthread_mutex_destroy failed with %d (%s)\n", iError, strerror(iError));
    }
#endif  // USE_POSIX_SEMAPHORES
}